

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

MemPage * btreePageFromDbPage(DbPage *pDbPage,Pgno pgno,BtShared *pBt)

{
  MemPage *pMVar1;
  u8 uVar2;
  
  pMVar1 = (MemPage *)pDbPage->pExtra;
  if (pMVar1->pgno != pgno) {
    pMVar1->aData = (u8 *)pDbPage->pData;
    pMVar1->pDbPage = pDbPage;
    pMVar1->pBt = pBt;
    pMVar1->pgno = pgno;
    uVar2 = 'd';
    if (pgno != 1) {
      uVar2 = '\0';
    }
    pMVar1->hdrOffset = uVar2;
  }
  return pMVar1;
}

Assistant:

static MemPage *btreePageFromDbPage(DbPage *pDbPage, Pgno pgno, BtShared *pBt){
  MemPage *pPage = (MemPage*)sqlite3PagerGetExtra(pDbPage);
  if( pgno!=pPage->pgno ){
    pPage->aData = sqlite3PagerGetData(pDbPage);
    pPage->pDbPage = pDbPage;
    pPage->pBt = pBt;
    pPage->pgno = pgno;
    pPage->hdrOffset = pgno==1 ? 100 : 0;
  }
  assert( pPage->aData==sqlite3PagerGetData(pDbPage) );
  return pPage; 
}